

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
kj::FunctionParam<int(char,bool)>::FunctionParam<kj::(anonymous_namespace)::TestCase135::run()::__2>
          (FunctionParam<int(char,bool)> *this,anon_class_4_1_54a39809 *func)

{
  anon_class_4_1_54a39809 *func_local;
  FunctionParam<int_(char,_bool)> *this_local;
  
  ctor<kj::FunctionParam<int(char,bool)>::Wrapper<kj::(anonymous_namespace)::TestCase135::run()::__2>,kj::(anonymous_namespace)::TestCase135::run()::__2&>
            ((Wrapper<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:162:45)>
              *)this,func);
  return;
}

Assistant:

FunctionParam(Func&& func) {
    typedef Wrapper<Decay<Func>> WrapperType;

    // All instances of Wrapper<Func> are two pointers in size: a vtable, and a Func&. So if we
    // allocate space for two pointers, we can construct a Wrapper<Func> in it!
    static_assert(sizeof(WrapperType) == sizeof(space),
        "expected WrapperType to be two pointers");

    // Even if `func` is an rvalue reference, it's OK to use it as an lvalue here, because
    // FunctionParam is used strictly for parameters. If we captured a temporary, we know that
    // temporary will not be destroyed until after the function call completes.
    ctor(*reinterpret_cast<WrapperType*>(space), func);
  }